

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O2

CURLcode Curl_fopen(Curl_easy *data,char *filename,FILE **fh,char **tempname)

{
  int iVar1;
  CURLcode CVar2;
  int iVar3;
  char *__file;
  FILE *pFVar4;
  uchar randsuffix [9];
  stat sb;
  stat nsb;
  
  *tempname = (char *)0x0;
  iVar1 = stat64(filename,(stat64 *)&sb);
  if ((iVar1 == -1) || ((sb.st_mode & 0xf000) != 0x8000)) {
    pFVar4 = fopen64(filename,"w");
    *fh = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      return CURLE_OK;
    }
    CVar2 = CURLE_WRITE_ERROR;
LAB_0012c51a:
    __file = (char *)0x0;
  }
  else {
    CVar2 = Curl_rand_hex(data,randsuffix,9);
    if (CVar2 != CURLE_OK) goto LAB_0012c51a;
    __file = curl_maprintf("%s.%s.tmp",filename,randsuffix);
    if (__file == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
      goto LAB_0012c51a;
    }
    iVar1 = open64(__file,0xc1,0x180);
    CVar2 = CURLE_WRITE_ERROR;
    if (iVar1 != -1) {
      iVar3 = fstat64(iVar1,(stat64 *)&nsb);
      if ((((iVar3 == -1) || (nsb.st_uid != sb.st_uid)) || (nsb.st_gid != sb.st_gid)) ||
         (iVar3 = fchmod(iVar1,sb.st_mode), iVar3 != -1)) {
        pFVar4 = fdopen(iVar1,"w");
        *fh = (FILE *)pFVar4;
        CVar2 = CURLE_OK;
        if (pFVar4 != (FILE *)0x0) goto LAB_0012c52e;
      }
      close(iVar1);
      unlink(__file);
      CVar2 = CURLE_WRITE_ERROR;
    }
  }
  (*Curl_cfree)(__file);
  __file = (char *)0x0;
LAB_0012c52e:
  *tempname = __file;
  return CVar2;
}

Assistant:

CURLcode Curl_fopen(struct Curl_easy *data, const char *filename,
                    FILE **fh, char **tempname)
{
  CURLcode result = CURLE_WRITE_ERROR;
  unsigned char randsuffix[9];
  char *tempstore = NULL;
  struct_stat sb;
  int fd = -1;
  *tempname = NULL;

  if(stat(filename, &sb) == -1 || !S_ISREG(sb.st_mode)) {
    /* a non-regular file, fallback to direct fopen() */
    *fh = fopen(filename, FOPEN_WRITETEXT);
    if(*fh)
      return CURLE_OK;
    goto fail;
  }

  result = Curl_rand_hex(data, randsuffix, sizeof(randsuffix));
  if(result)
    goto fail;

  tempstore = aprintf("%s.%s.tmp", filename, randsuffix);
  if(!tempstore) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = CURLE_WRITE_ERROR;
  fd = open(tempstore, O_WRONLY | O_CREAT | O_EXCL, 0600);
  if(fd == -1)
    goto fail;

#ifdef HAVE_FCHMOD
  {
    struct_stat nsb;
    if((fstat(fd, &nsb) != -1) &&
       (nsb.st_uid == sb.st_uid) && (nsb.st_gid == sb.st_gid)) {
      /* if the user and group are the same, clone the original mode */
      if(fchmod(fd, sb.st_mode) == -1)
        goto fail;
    }
  }
#endif

  *fh = fdopen(fd, FOPEN_WRITETEXT);
  if(!*fh)
    goto fail;

  *tempname = tempstore;
  return CURLE_OK;

fail:
  if(fd != -1) {
    close(fd);
    unlink(tempstore);
  }

  free(tempstore);

  *tempname = NULL;
  return result;
}